

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::ClearOpsBufferStorageTestCase::execute
          (ClearOpsBufferStorageTestCase *this,GLuint sparse_bo_storage_flags)

{
  byte bVar1;
  uint uVar2;
  GLenum GVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  byte bVar7;
  undefined8 unaff_RBP;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  uint data_rgba8;
  undefined4 local_1dc;
  ClearOpsBufferStorageTestCase *local_1d8;
  uint local_1cc;
  long local_1c8;
  char *local_1c0;
  void *local_1b8;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  
  local_1dc = 0x12345678;
  bVar5 = true;
  uVar8 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  local_1d8 = this;
  do {
    local_1c0 = "glClearBufferSubData()";
    if ((byte)uVar8 != 0) {
      local_1c0 = "glClearBufferData()";
    }
    local_1cc = (uint)uVar8;
    local_1c8 = (ulong)((byte)~(byte)uVar8 & 1) * 3 + 0x13;
    uVar2 = 1;
    do {
      if ((char)uVar2 == '\0') {
        (*this->m_gl->bindBuffer)(0x8892,this->m_sparse_bo);
        GVar3 = (*this->m_gl->getError)();
        glu::checkError(GVar3,"glBindBuffer() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x678);
        uVar10 = (ulong)(this->m_sparse_bo_size_rounded >> 1);
        (*this->m_gl->bufferPageCommitmentARB)(0x8892,uVar10,uVar10,'\x01');
        GVar3 = (*this->m_gl->getError)();
        glu::checkError(GVar3,"glBufferPageCommitmentARB() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x67d);
      }
      (*this->m_gl->bindBuffer)(0x8892,this->m_helper_bo);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glBindBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x682);
      (*this->m_gl->bufferSubData)
                (0x8892,0,(ulong)this->m_sparse_bo_size_rounded,this->m_initial_data);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glBufferSubData() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x686);
      (*this->m_gl->bindBuffer)(0x8f36,this->m_helper_bo);
      (*this->m_gl->bindBuffer)(0x8f37,this->m_sparse_bo);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glBindBuffer() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x68a);
      (*this->m_gl->copyBufferSubData)(0x8f36,0x8f37,0,0,(ulong)this->m_sparse_bo_size_rounded);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glCopyBufferSubData() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x691);
      uVar11 = this->m_sparse_bo_size_rounded;
      if ((uVar8 & 1) == 0) {
        uVar10 = (ulong)(uVar11 >> 1);
        (*this->m_gl->clearBufferSubData)(0x8f37,0x8058,uVar10,uVar10,0x1908,0x1401,&local_1dc);
        GVar3 = (*this->m_gl->getError)();
        glu::checkError(GVar3,"glClearBufferSubData() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x6ab);
        uVar8 = uVar10;
      }
      else {
        (*this->m_gl->clearBufferData)(0x8f37,0x8058,0x1908,0x1401,&local_1dc);
        GVar3 = (*this->m_gl->getError)();
        glu::checkError(GVar3,"glClearBufferData() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x69f);
        uVar10 = 0;
        uVar8 = (ulong)uVar11;
      }
      (*this->m_gl->copyBufferSubData)(0x8f37,0x8f36,0,0,(ulong)this->m_sparse_bo_size_rounded);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glCopyBufferSubData() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x6b6);
      local_1b8 = (*this->m_gl->mapBufferRange)(0x8f36,0,(ulong)this->m_sparse_bo_size_rounded,1);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glMapBufferRange() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x6bb);
      uVar11 = (uint)uVar10;
      bVar7 = 1;
      if (uVar11 != 0) {
        uVar12 = 0;
        do {
          bVar7 = local_1d8->m_initial_data[uVar12];
          bVar4 = *(byte *)((long)local_1b8 + uVar12);
          if (bVar7 != bVar4) {
            local_1b0 = (undefined1  [8])local_1d8->m_testCtx->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "Unmodified buffer object region has invalid contents. Expected byte ",0x44);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
            std::ostream::operator<<((ostringstream *)local_1a8,(uint)bVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"], found byte:[",0xf);
            std::ostream::operator<<((ostringstream *)local_1a8,(uint)bVar4);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"] at index [",0xc);
            std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"]; call type:[",0xe);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_1c0,local_1c8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"], all required pages committed?:[",0x22);
            pcVar9 = "no";
            if (uVar2 != 0) {
              pcVar9 = "yes";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,pcVar9,(ulong)uVar2 | 2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            bVar7 = 0;
            goto LAB_00a4f5e3;
          }
          uVar12 = uVar12 + 1;
        } while (uVar10 != uVar12);
        bVar7 = 1;
      }
LAB_00a4f5e3:
      bVar4 = 1;
      if (uVar2 == 0) {
        uVar8 = 0;
      }
      if (uVar11 < (int)uVar8 + uVar11) {
        iVar6 = uVar11 << 3;
        do {
          bVar1 = *(byte *)((long)local_1b8 + uVar10);
          uVar11 = (0xff << ((byte)iVar6 & 0x1f) & 0x12345678U) >> ((byte)iVar6 & 0x1f) & 0x7e;
          if (uVar11 != bVar1) {
            local_1b0 = (undefined1  [8])local_1d8->m_testCtx->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "Unmodified buffer object region has invalid contents. Expected byte ",0x44);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
            std::ostream::operator<<((ostringstream *)local_1a8,uVar11);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"], found byte:[",0xf);
            std::ostream::operator<<((ostringstream *)local_1a8,(uint)bVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"] at index [",0xc);
            std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"]; call type:[",0xe);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_1c0,local_1c8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"], all required pages committed?:[",0x22);
            pcVar9 = "no";
            if (uVar2 != 0) {
              pcVar9 = "yes";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,pcVar9,(ulong)uVar2 | 2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            bVar4 = 0;
            break;
          }
          uVar10 = uVar10 + 1;
          iVar6 = iVar6 + 8;
          uVar11 = (int)uVar8 - 1;
          uVar8 = (ulong)uVar11;
        } while (uVar11 != 0);
      }
      this = local_1d8;
      bVar5 = (bool)(bVar5 & bVar7 & bVar4);
      (*local_1d8->m_gl->unmapBuffer)(0x8f36);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glUnmapBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x710);
      bVar13 = uVar2 != 0;
      uVar2 = 0;
      uVar8 = (ulong)local_1cc;
    } while (bVar13);
    uVar8 = 0;
    if ((local_1cc & 1) == 0) {
      return bVar5;
    }
  } while( true );
}

Assistant:

bool ClearOpsBufferStorageTestCase::execute(glw::GLuint sparse_bo_storage_flags)
{
	(void)sparse_bo_storage_flags;
	bool			   result	 = true;
	const unsigned int data_rgba8 = 0x12345678;

	for (unsigned int n_clear_op_type = 0; n_clear_op_type < 2; /* glClearBufferData(), glClearBufferSubData() */
		 ++n_clear_op_type)
	{
		const bool use_clear_buffer_data_call = (n_clear_op_type == 0);

		/* We will run the test case in two iterations:
		 *
		 * 1) All pages will have a physical backing.
		 * 2) Half of the pages will have a physical backing.
		 */
		for (unsigned int n_iteration = 0; n_iteration < 2; ++n_iteration)
		{
			/* By default, for each iteration all sparse buffer pages are commited.
			 *
			 * For the last iteration, we need to de-commit the latter half before
			 * proceeding with the test.
			 */
			const bool all_pages_committed = (n_iteration == 0);

			if (!all_pages_committed)
			{
				m_gl.bindBuffer(GL_ARRAY_BUFFER, m_sparse_bo);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

				m_gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, m_sparse_bo_size_rounded / 2, /* offset */
											 m_sparse_bo_size_rounded / 2,					/* size   */
											 GL_TRUE);										/* commit */
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");
			}

			/* Set up the sparse buffer contents */
			m_gl.bindBuffer(GL_ARRAY_BUFFER, m_helper_bo);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

			m_gl.bufferSubData(GL_ARRAY_BUFFER, 0, /* offset */
							   m_sparse_bo_size_rounded, m_initial_data);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferSubData() call failed.");

			m_gl.bindBuffer(GL_COPY_READ_BUFFER, m_helper_bo);
			m_gl.bindBuffer(GL_COPY_WRITE_BUFFER, m_sparse_bo);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call(s) failed.");

			m_gl.copyBufferSubData(GL_COPY_READ_BUFFER,  /* readTarget  */
								   GL_COPY_WRITE_BUFFER, /* writeTarget */
								   0,					 /* readOffset */
								   0,					 /* writeOffset */
								   m_sparse_bo_size_rounded);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");

			/* Issue the clear call */
			unsigned int clear_region_size		   = 0;
			unsigned int clear_region_start_offset = 0;

			if (use_clear_buffer_data_call)
			{
				DE_ASSERT((m_sparse_bo_size_rounded % sizeof(unsigned int)) == 0);

				clear_region_size		  = m_sparse_bo_size_rounded;
				clear_region_start_offset = 0;

				m_gl.clearBufferData(GL_COPY_WRITE_BUFFER, GL_RGBA8, GL_RGBA, GL_UNSIGNED_BYTE, &data_rgba8);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glClearBufferData() call failed.");
			}
			else
			{
				DE_ASSERT(((m_sparse_bo_size_rounded / 2) % sizeof(unsigned int)) == 0);
				DE_ASSERT(((m_sparse_bo_size_rounded) % sizeof(unsigned int)) == 0);

				clear_region_size		  = m_sparse_bo_size_rounded / 2;
				clear_region_start_offset = m_sparse_bo_size_rounded / 2;

				m_gl.clearBufferSubData(GL_COPY_WRITE_BUFFER, GL_RGBA8, clear_region_start_offset, clear_region_size,
										GL_RGBA, GL_UNSIGNED_BYTE, &data_rgba8);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glClearBufferSubData() call failed.");
			}

			/* Retrieve the modified buffer's contents */
			const unsigned char* result_data = NULL;

			m_gl.copyBufferSubData(GL_COPY_WRITE_BUFFER, /* readTarget  */
								   GL_COPY_READ_BUFFER,  /* writeTarget */
								   0,					 /* readOffset  */
								   0,					 /* writeOffset */
								   m_sparse_bo_size_rounded);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");

			result_data = (unsigned char*)m_gl.mapBufferRange(GL_COPY_READ_BUFFER, 0, /* offset */
															  m_sparse_bo_size_rounded, GL_MAP_READ_BIT);

			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glMapBufferRange() call failed.");

			/* Verify the result data: unmodified region */
			bool			   result_local			  = true;
			const unsigned int unmodified_region_size = (use_clear_buffer_data_call) ? 0 : clear_region_start_offset;
			const unsigned int unmodified_region_start_offset = 0;

			for (unsigned int n_current_byte = unmodified_region_start_offset;
				 (n_current_byte < unmodified_region_start_offset + unmodified_region_size) && result_local;
				 ++n_current_byte)
			{
				const unsigned int  current_initial_data_offset = n_current_byte - unmodified_region_start_offset;
				const unsigned char expected_value				= m_initial_data[current_initial_data_offset];
				const unsigned char found_value					= result_data[n_current_byte];

				if (expected_value != found_value)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Unmodified buffer object region has invalid contents. Expected byte "
									   << "[" << (int)expected_value << "]"
																		", found byte:"
																		"["
									   << (int)found_value << "]"
															  " at index "
															  "["
									   << n_current_byte << "]; "
															"call type:"
															"["
									   << ((use_clear_buffer_data_call) ? "glClearBufferData()" :
																		  "glClearBufferSubData()")
									   << "]"
										  ", all required pages committed?:"
										  "["
									   << ((all_pages_committed) ? "yes" : "no") << "]" << tcu::TestLog::EndMessage;

					result_local = false;
					break;
				}
			}

			result &= result_local;
			result_local = true;

			/* Verify the result data: modified region (clamped to the memory region
			 * with actual physical backing) */
			const unsigned int modified_region_size			= (all_pages_committed) ? clear_region_size : 0;
			const unsigned int modified_region_start_offset = clear_region_start_offset;

			for (unsigned int n_current_byte = modified_region_start_offset;
				 (n_current_byte < modified_region_start_offset + modified_region_size) && result_local;
				 ++n_current_byte)
			{
				const unsigned char expected_value =
					static_cast<unsigned char>((data_rgba8 & (0xFF << (n_current_byte * 8))) >> (n_current_byte * 8));
				const unsigned char found_value = result_data[n_current_byte];

				if (expected_value != found_value)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Unmodified buffer object region has invalid contents. Expected byte "
									   << "[" << (int)expected_value << "]"
																		", found byte:"
																		"["
									   << (int)found_value << "]"
															  " at index "
															  "["
									   << n_current_byte << "]; "
															"call type:"
															"["
									   << ((use_clear_buffer_data_call) ? "glClearBufferData()" :
																		  "glClearBufferSubData()")
									   << "]"
										  ", all required pages committed?:"
										  "["
									   << ((all_pages_committed) ? "yes" : "no") << "]" << tcu::TestLog::EndMessage;

					result_local = false;
					break;
				}
			}

			result &= result_local;

			/* Unmap the storage before proceeding */
			m_gl.unmapBuffer(GL_COPY_READ_BUFFER);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUnmapBuffer() call failed.");
		} /* for (both iterations) */
	}	 /* for (both clear types) */

	return result;
}